

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O0

void timer(int signum)

{
  int signum_local;
  
  logmsg("alarm!");
  timeout = timeout + 5;
  if (maxtimeout <= timeout) {
    if (wrotepidfile != 0) {
      wrotepidfile = 0;
      unlink(pidname);
    }
    if (serverlogslocked != 0) {
      serverlogslocked = 0;
      clear_advisor_read_lock("log/serverlogs.lock");
    }
    exit(1);
  }
  siglongjmp((__jmp_buf_tag *)timeoutbuf,1);
}

Assistant:

static void timer(int signum)
{
  (void)signum;

  logmsg("alarm!");

  timeout += rexmtval;
  if(timeout >= maxtimeout) {
    if(wrotepidfile) {
      wrotepidfile = 0;
      unlink(pidname);
    }
    if(serverlogslocked) {
      serverlogslocked = 0;
      clear_advisor_read_lock(SERVERLOGS_LOCK);
    }
    exit(1);
  }
#ifdef HAVE_SIGSETJMP
  siglongjmp(timeoutbuf, 1);
#endif
}